

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float text_base_offset;
  float line_height;
  ImGuiWindow *window;
  ImGuiContext *g;
  float text_offset_y_local;
  ImVec2 *size_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    fVar3 = ImMax<float>((pIVar1->DC).CurrLineSize.y,size->y);
    fVar4 = ImMax<float>((pIVar1->DC).CurrLineTextBaseOffset,text_offset_y);
    (pIVar1->DC).CursorPosPrevLine.x = (pIVar1->DC).CursorPos.x + size->x;
    (pIVar1->DC).CursorPosPrevLine.y = (pIVar1->DC).CursorPos.y;
    (pIVar1->DC).CursorPos.x =
         (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + (pIVar1->DC).ColumnsOffset.x);
    (pIVar1->DC).CursorPos.y =
         (float)(int)((pIVar1->DC).CursorPos.y + fVar3 + (pIVar2->Style).ItemSpacing.y);
    fVar5 = ImMax<float>((pIVar1->DC).CursorMaxPos.x,(pIVar1->DC).CursorPosPrevLine.x);
    (pIVar1->DC).CursorMaxPos.x = fVar5;
    fVar5 = ImMax<float>((pIVar1->DC).CursorMaxPos.y,
                         (pIVar1->DC).CursorPos.y - (pIVar2->Style).ItemSpacing.y);
    (pIVar1->DC).CursorMaxPos.y = fVar5;
    (pIVar1->DC).PrevLineSize.y = fVar3;
    (pIVar1->DC).PrevLineTextBaseOffset = fVar4;
    (pIVar1->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar1->DC).CurrLineSize.y = 0.0;
    if ((pIVar1->DC).LayoutType == 0) {
      SameLine(0.0,-1.0);
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y);
    const float text_base_offset = ImMax(window->DC.CurrLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrLineSize.y = window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}